

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,try_statement *s)

{
  block_statement *pbVar1;
  wostream *pwVar2;
  wstring *pwVar3;
  block_statement *f;
  block_statement *c;
  try_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,"try ");
  pbVar1 = try_statement::block(s);
  accept<mjs::print_visitor>(&pbVar1->super_statement,this);
  pbVar1 = try_statement::catch_block(s);
  if (pbVar1 != (block_statement *)0x0) {
    pwVar2 = std::operator<<(this->os_," catch(");
    pwVar3 = try_statement::catch_id_abi_cxx11_(s);
    pwVar2 = std::operator<<(pwVar2,(wstring *)pwVar3);
    std::operator<<(pwVar2,") ");
    accept<mjs::print_visitor>(&pbVar1->super_statement,this);
  }
  pbVar1 = try_statement::finally_block(s);
  if (pbVar1 != (block_statement *)0x0) {
    std::operator<<(this->os_," finally ");
    accept<mjs::print_visitor>(&pbVar1->super_statement,this);
  }
  return;
}

Assistant:

void operator()(const try_statement& s) {
        os_ << "try ";
        accept(s.block(), *this);
        if (auto c = s.catch_block()) {
            os_ << " catch(" << s.catch_id() << ") ";
            accept(*c, *this);
        }
        if (auto f = s.finally_block()) {
            os_ << " finally ";
            accept(*f, *this);
        }
    }